

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

NodePtr avro::makeArrayNode(Entity *e,Object *m,SymbolTable *st,string *ns)

{
  const_iterator cVar1;
  NodeArray *p;
  element_type *extraout_RAX;
  shared_count extraout_RDX;
  string *in_R8;
  Node *__tmp;
  NodePtr NVar2;
  SingleAttribute<boost::shared_ptr<avro::Node>_> n;
  element_type *local_68;
  shared_count local_60;
  string local_58;
  element_type *local_38;
  shared_count local_30;
  
  local_58.field_2._M_allocated_capacity._0_4_ = 0x6d657469;
  local_58.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_58._M_string_length = 5;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  cVar1 = findField((Entity *)m,(Object *)st,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT26(local_58.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_58.field_2._M_allocated_capacity._4_2_,
                                      local_58.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  p = (NodeArray *)operator_new(0x28);
  makeNode((avro *)&local_68,(Entity *)(cVar1._M_node + 2),(SymbolTable *)ns,in_R8);
  if (local_60.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_60.pi_)->use_count_ = (local_60.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_38 = local_68;
  local_30.pi_ = local_60.pi_;
  boost::detail::shared_count::~shared_count((shared_count *)&local_58._M_string_length);
  (p->super_NodeImplArray).super_Node.type_ = AVRO_ARRAY;
  (p->super_NodeImplArray).super_Node.locked_ = false;
  (p->super_NodeImplArray).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_001807a0;
  (p->super_NodeImplArray).leafAttributes_.attr_.px = local_68;
  (p->super_NodeImplArray).leafAttributes_.attr_.pn.pi_ = local_60.pi_;
  if (local_60.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_60.pi_)->use_count_ = (local_60.pi_)->use_count_ + 1;
    UNLOCK();
  }
  (p->super_NodeImplArray).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00180fb8;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeArray>((shared_ptr<avro::Node> *)e,p);
  boost::detail::shared_count::~shared_count(&local_30);
  boost::detail::shared_count::~shared_count(&local_60);
  NVar2.pn.pi_ = extraout_RDX.pi_;
  NVar2.px = extraout_RAX;
  return NVar2;
}

Assistant:

static NodePtr makeArrayNode(const Entity& e, const Object& m,
    SymbolTable& st, const string& ns)
{
    Object::const_iterator it = findField(e, m, "items");
    return NodePtr(new NodeArray(asSingleAttribute(
        makeNode(it->second, st, ns))));
}